

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PathDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PathDescriptionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          PathDescriptionSyntax *args_1,Token *args_2,Token *args_3,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_4,Token *args_5,Token *args_6)

{
  Token openParen;
  Token closeParen;
  Token semi;
  PathDeclarationSyntax *pPVar1;
  Token *in_RCX;
  undefined8 in_RDX;
  Info *unaff_RBX;
  Info *in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  undefined8 *in_stack_00000008;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  BumpAllocator *in_stack_ffffffffffffff68;
  
  pPVar1 = (PathDeclarationSyntax *)
           allocate(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  openParen.info = (Info *)in_RCX;
  openParen._0_8_ = in_R8;
  closeParen.info = in_RSI;
  closeParen.kind = (short)in_RDX;
  closeParen._2_1_ = (char)((ulong)in_RDX >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  closeParen.rawLen = (int)((ulong)in_RDX >> 0x20);
  semi.info = unaff_RBX;
  semi.kind = (short)in_RDI;
  semi._2_1_ = (char)((ulong)in_RDI >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  semi.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::PathDeclarationSyntax::PathDeclarationSyntax
            ((PathDeclarationSyntax *)in_R8[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_R8,
             (PathDescriptionSyntax *)in_stack_00000008[1],*in_RCX,openParen,
             (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)*in_stack_00000008,closeParen,
             semi);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }